

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::doPossDup(Session *this,Message *msg)

{
  field_metrics message;
  bool bVar1;
  int field;
  allocator<char> local_111;
  string local_110;
  DateTime local_f0;
  DateTime local_d8;
  undefined4 local_bc;
  UtcTimeStampField *local_b8;
  SendingTime *sendingTime;
  MsgType *msgType;
  Header *header;
  UtcTimeStamp local_90;
  undefined1 local_78 [8];
  OrigSendingTime origSendingTime;
  Message *msg_local;
  Session *this_local;
  
  origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics = (field_metrics)msg;
  std::function<FIX::UtcTimeStamp_()>::operator()(&local_90,&this->m_timestamper);
  OrigSendingTime::OrigSendingTime((OrigSendingTime *)local_78,&local_90);
  UtcTimeStamp::~UtcTimeStamp(&local_90);
  msgType = (MsgType *)
            Message::getHeader((Message *)
                               origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics);
  sendingTime = (SendingTime *)FieldMap::getField<FIX::MsgType>((FieldMap *)msgType);
  local_b8 = &FieldMap::getField<FIX::SendingTime>((FieldMap *)msgType)->super_UtcTimeStampField;
  bVar1 = FIX::operator!=((StringField *)sendingTime,"4");
  if (bVar1) {
    bVar1 = FieldMap::getFieldIfSet((FieldMap *)msgType,(FieldBase *)local_78);
    message = origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics;
    if (!bVar1) {
      field = FieldBase::getTag((FieldBase *)local_78);
      generateReject(this,(Message *)message,1,field);
      this_local._7_1_ = false;
      goto LAB_002a5b25;
    }
    UtcTimeStampField::operator_cast_to_UtcTimeStamp
              ((UtcTimeStamp *)&local_d8,(UtcTimeStampField *)local_78);
    UtcTimeStampField::operator_cast_to_UtcTimeStamp((UtcTimeStamp *)&local_f0,local_b8);
    bVar1 = operator>(&local_d8,&local_f0);
    UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&local_f0);
    UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&local_d8);
    if (bVar1) {
      generateReject(this,(Message *)
                          origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics,10,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
      generateLogout(this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      this_local._7_1_ = false;
      goto LAB_002a5b25;
    }
  }
  this_local._7_1_ = true;
LAB_002a5b25:
  local_bc = 1;
  OrigSendingTime::~OrigSendingTime((OrigSendingTime *)local_78);
  return this_local._7_1_;
}

Assistant:

bool Session::doPossDup(const Message &msg) {
  OrigSendingTime origSendingTime = m_timestamper();

  const Header &header = msg.getHeader();
  auto const &msgType = header.getField<MsgType>();
  auto const &sendingTime = header.getField<SendingTime>();

  if (msgType != MsgType_SequenceReset) {
    if (!header.getFieldIfSet(origSendingTime)) {
      generateReject(msg, SessionRejectReason_REQUIRED_TAG_MISSING, origSendingTime.getTag());
      return false;
    }

    if (origSendingTime > sendingTime) {
      generateReject(msg, SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM);
      generateLogout();
      return false;
    }
  }
  return true;
}